

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

void __thiscall Func::AddFrameDisplayCheck(Func *this,SymOpnd *fieldOpnd,uint32 slotId)

{
  uint value;
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  HashTable<FrameDisplayCheckRecord_*,_Memory::JitArenaAllocator> *pHVar4;
  JitArenaAllocator *pJVar5;
  FrameDisplayCheckRecord *this_00;
  HashTable<unsigned_int,_Memory::JitArenaAllocator> *pHVar6;
  uint *puVar7;
  uint32 *pSlotId;
  uint32 frameDisplaySlot;
  TrackAllocData local_58;
  FrameDisplayCheckRecord **local_30;
  FrameDisplayCheckRecord **record;
  PropertySym *propertySym;
  SymOpnd *pSStack_18;
  uint32 slotId_local;
  SymOpnd *fieldOpnd_local;
  Func *this_local;
  
  propertySym._4_4_ = slotId;
  pSStack_18 = fieldOpnd;
  fieldOpnd_local = (SymOpnd *)this;
  sourceContextId = GetSourceContextId(this);
  functionId = GetLocalFunctionId(this);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,ClosureRangeCheckPhase,sourceContextId,functionId);
  if (!bVar2) {
    bVar2 = IsTopFunc(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x411,"(IsTopFunc())","IsTopFunc()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if (this->frameDisplayCheckTable == (FrameDisplayCheckTable *)0x0) {
      pHVar4 = HashTable<FrameDisplayCheckRecord_*,_Memory::JitArenaAllocator>::New(this->m_alloc,4)
      ;
      this->frameDisplayCheckTable = pHVar4;
    }
    record = (FrameDisplayCheckRecord **)Sym::AsPropertySym(pSStack_18->m_sym);
    local_30 = HashTable<FrameDisplayCheckRecord_*,_Memory::JitArenaAllocator>::FindOrInsertNew
                         (this->frameDisplayCheckTable,
                          (((PropertySym *)record)->m_stackSym->super_Sym).m_id);
    if (*local_30 == (FrameDisplayCheckRecord *)0x0) {
      pJVar5 = this->m_alloc;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_58,(type_info *)&FrameDisplayCheckRecord::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                 ,0x41b);
      pJVar5 = (JitArenaAllocator *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                              pJVar5,&local_58);
      this_00 = (FrameDisplayCheckRecord *)new<Memory::JitArenaAllocator>(0x10,pJVar5,0x4e98c0);
      FrameDisplayCheckRecord::FrameDisplayCheckRecord(this_00);
      *local_30 = this_00;
    }
    value = *(uint *)(record + 3);
    if (((*local_30)->table == (SlotArrayCheckTable *)0x0) || ((*local_30)->slotId < value)) {
      (*local_30)->slotId = value;
    }
    if (propertySym._4_4_ != 0xffffffff) {
      if ((*local_30)->table == (SlotArrayCheckTable *)0x0) {
        pHVar6 = HashTable<unsigned_int,_Memory::JitArenaAllocator>::New(this->m_alloc,4);
        (*local_30)->table = pHVar6;
      }
      puVar7 = HashTable<unsigned_int,_Memory::JitArenaAllocator>::FindOrInsert
                         ((*local_30)->table,propertySym._4_4_,value);
      if ((puVar7 != (uint *)0x0) && (*puVar7 < propertySym._4_4_)) {
        *puVar7 = propertySym._4_4_;
      }
    }
  }
  return;
}

Assistant:

void Func::AddFrameDisplayCheck(IR::SymOpnd *fieldOpnd, uint32 slotId)
{
    if (PHASE_OFF(Js::ClosureRangeCheckPhase, this))
    {
        return;
    }

    Assert(IsTopFunc());
    if (this->frameDisplayCheckTable == nullptr)
    {
        this->frameDisplayCheckTable = FrameDisplayCheckTable::New(m_alloc, 4);
    }

    PropertySym *propertySym = fieldOpnd->m_sym->AsPropertySym();
    FrameDisplayCheckRecord **record = this->frameDisplayCheckTable->FindOrInsertNew(propertySym->m_stackSym->m_id);
    if (*record == nullptr)
    {
        *record = JitAnew(m_alloc, FrameDisplayCheckRecord);
    }

    uint32 frameDisplaySlot = propertySym->m_propertyId;
    if ((*record)->table == nullptr || (*record)->slotId < frameDisplaySlot)
    {
        (*record)->slotId = frameDisplaySlot;
    }

    if (slotId != (uint32)-1)
    {
        if ((*record)->table == nullptr)
        {
            (*record)->table = SlotArrayCheckTable::New(m_alloc, 4);
        }
        uint32 *pSlotId = (*record)->table->FindOrInsert(slotId, frameDisplaySlot);
        if (pSlotId && *pSlotId < slotId)
        {
            *pSlotId = slotId;
        }
    }
}